

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_file_hash_dictionary_handler.c
# Opt level: O2

ion_err_t oafdict_destroy_dictionary(ion_dictionary_id_t id)

{
  ion_err_t iVar1;
  int iVar2;
  char addr_filename [12];
  char local_c [12];
  
  iVar2 = dictionary_get_filename(id,"oaf",local_c);
  iVar1 = '\x04';
  if (iVar2 < 0xc) {
    remove(local_c);
    iVar1 = '\0';
  }
  return iVar1;
}

Assistant:

ion_err_t
oafdict_destroy_dictionary(
	ion_dictionary_id_t id
) {
	char addr_filename[ION_MAX_FILENAME_LENGTH];

	int actual_filename_length = dictionary_get_filename(id, "oaf", addr_filename);

	if (actual_filename_length >= ION_MAX_FILENAME_LENGTH) {
		return err_dictionary_destruction_error;
	}

	fremove(addr_filename);

	return err_ok;
}